

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O0

int * __thiscall
TMap<FString,_int,_THashTraits<FString>,_TValueTraits<int>_>::Insert
          (TMap<FString,_int,_THashTraits<FString>,_TValueTraits<int>_> *this,FString *key,
          int *value)

{
  Node *pNVar1;
  FString local_48 [3];
  FString local_30;
  Node *local_28;
  Node *n;
  int *value_local;
  FString *key_local;
  TMap<FString,_int,_THashTraits<FString>,_TValueTraits<int>_> *this_local;
  
  n = (Node *)value;
  value_local = (int *)key;
  key_local = (FString *)this;
  FString::FString(&local_30,key);
  pNVar1 = FindKey(this,&local_30);
  FString::~FString(&local_30);
  local_28 = pNVar1;
  if (pNVar1 == (Node *)0x0) {
    FString::FString(local_48,key);
    local_28 = NewKey(this,local_48);
    FString::~FString(local_48);
    (local_28->Pair).Value = *(int *)&n->Next;
  }
  else {
    (pNVar1->Pair).Value = *(int *)&n->Next;
  }
  return &(local_28->Pair).Value;
}

Assistant:

VT &Insert(const KT key, const VT &value)
	{
		Node *n = FindKey(key);
		if (n != NULL)
		{
			n->Pair.Value = value;
		}
		else
		{
			n = NewKey(key);
			::new(&n->Pair.Value) VT(value);
		}
		return n->Pair.Value;
	}